

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

string * __thiscall
tinyusdz::tydra::(anonymous_namespace)::DumpXformNodeRec_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,XformNode *node,
          uint32_t indent)

{
  bool bVar1;
  ostream *poVar2;
  matrix4d *pmVar3;
  vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *this_00;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t n_03;
  string local_288;
  string local_268;
  reference local_248;
  XformNode *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_> *__range2;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  XformNode *pXStack_18;
  uint32_t indent_local;
  XformNode *node_local;
  
  local_1c = (uint)node;
  pXStack_18 = (XformNode *)this;
  node_local = (XformNode *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  poVar2 = ::std::operator<<(poVar2,"Prim name: ");
  poVar2 = ::std::operator<<(poVar2,(string *)pXStack_18);
  poVar2 = ::std::operator<<(poVar2," PrimID: ");
  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,pXStack_18->prim_id);
  poVar2 = ::std::operator<<(poVar2," (Path ");
  poVar2 = ::std::operator<<(poVar2,&pXStack_18->absolute_path);
  poVar2 = ::std::operator<<(poVar2,") Xformable? ");
  bVar1 = XformNode::has_xform(pXStack_18);
  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,bVar1);
  poVar2 = ::std::operator<<(poVar2," resetXformStack? ");
  bVar1 = XformNode::has_resetXformStack(pXStack_18);
  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,bVar1);
  ::std::operator<<(poVar2," {\n");
  ::std::__cxx11::string::~string((string *)&local_1c8);
  pprint::Indent_abi_cxx11_(&local_1e8,(pprint *)(ulong)(local_1c + 1),n_00);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1e8);
  poVar2 = ::std::operator<<(poVar2,"parent_world: ");
  pmVar3 = XformNode::get_parent_world_matrix(pXStack_18);
  poVar2 = ::std::operator<<(poVar2,pmVar3);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&local_1e8);
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)(local_1c + 1),n_01);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_208);
  poVar2 = ::std::operator<<(poVar2,"world: ");
  pmVar3 = XformNode::get_world_matrix(pXStack_18);
  poVar2 = ::std::operator<<(poVar2,pmVar3);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&local_208);
  pprint::Indent_abi_cxx11_((string *)&__range2,(pprint *)(ulong)(local_1c + 1),n_02);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&__range2);
  poVar2 = ::std::operator<<(poVar2,"local: ");
  pmVar3 = XformNode::get_local_matrix(pXStack_18);
  poVar2 = ::std::operator<<(poVar2,pmVar3);
  ::std::operator<<(poVar2,"\n");
  ::std::__cxx11::string::~string((string *)&__range2);
  this_00 = &pXStack_18->children;
  __end2 = ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
           begin(this_00);
  child = (XformNode *)
          ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
          end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_tinyusdz::tydra::XformNode_*,_std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>_>
                                *)&child);
    if (!bVar1) break;
    local_248 = __gnu_cxx::
                __normal_iterator<const_tinyusdz::tydra::XformNode_*,_std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>_>
                ::operator*(&__end2);
    DumpXformNodeRec_abi_cxx11_
              (&local_268,(_anonymous_namespace_ *)local_248,(XformNode *)(ulong)(local_1c + 1),
               indent);
    ::std::operator<<(aoStack_198,(string *)&local_268);
    ::std::__cxx11::string::~string((string *)&local_268);
    __gnu_cxx::
    __normal_iterator<const_tinyusdz::tydra::XformNode_*,_std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>_>
    ::operator++(&__end2);
  }
  pprint::Indent_abi_cxx11_(&local_288,(pprint *)(ulong)(local_1c + 1),n_03);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_288);
  ::std::operator<<(poVar2,"}\n");
  ::std::__cxx11::string::~string((string *)&local_288);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string DumpXformNodeRec(const XformNode &node, uint32_t indent) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << "Prim name: " << node.element_name
     << " PrimID: " << node.prim_id << " (Path " << node.absolute_path
     << ") Xformable? " << node.has_xform() << " resetXformStack? "
     << node.has_resetXformStack() << " {\n";
  ss << pprint::Indent(indent + 1)
     << "parent_world: " << node.get_parent_world_matrix() << "\n";
  ss << pprint::Indent(indent + 1) << "world: " << node.get_world_matrix()
     << "\n";
  ss << pprint::Indent(indent + 1) << "local: " << node.get_local_matrix()
     << "\n";

  for (const auto &child : node.children) {
    ss << DumpXformNodeRec(child, indent + 1);
  }
  ss << pprint::Indent(indent + 1) << "}\n";

  return ss.str();
}